

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O1

void __thiscall
QtGraphicsAnchorLayout::ParallelAnchorData::updateChildrenSizes(ParallelAnchorData *this)

{
  qreal qVar1;
  qreal qVar2;
  AnchorData *pAVar3;
  AnchorData *pAVar4;
  undefined4 uVar5;
  uint uVar6;
  
  pAVar3 = this->firstEdge;
  qVar1 = (this->super_AnchorData).sizeAtPreferred;
  pAVar3->sizeAtMinimum = (this->super_AnchorData).sizeAtMinimum;
  pAVar3->sizeAtPreferred = qVar1;
  pAVar3->sizeAtMaximum = (this->super_AnchorData).sizeAtMaximum;
  pAVar4 = this->secondEdge;
  qVar1 = (this->super_AnchorData).sizeAtMinimum;
  if (pAVar3->from == pAVar4->from) {
    pAVar4->sizeAtMinimum = qVar1;
    pAVar4->sizeAtPreferred = (this->super_AnchorData).sizeAtPreferred;
    qVar1 = (this->super_AnchorData).sizeAtMaximum;
    uVar5 = SUB84(qVar1,0);
    uVar6 = (uint)((ulong)qVar1 >> 0x20);
  }
  else {
    qVar2 = (this->super_AnchorData).sizeAtPreferred;
    *(int *)&pAVar4->sizeAtMinimum = SUB84(qVar1,0);
    *(uint *)((long)&pAVar4->sizeAtMinimum + 4) = (uint)((ulong)qVar1 >> 0x20) ^ 0x80000000;
    *(int *)&pAVar4->sizeAtPreferred = SUB84(qVar2,0);
    *(uint *)((long)&pAVar4->sizeAtPreferred + 4) = (uint)((ulong)qVar2 >> 0x20) ^ 0x80000000;
    qVar1 = (this->super_AnchorData).sizeAtMaximum;
    uVar5 = SUB84(qVar1,0);
    uVar6 = (uint)((ulong)qVar1 >> 0x20) ^ 0x80000000;
  }
  pAVar4->sizeAtMaximum = (qreal)CONCAT44(uVar6,uVar5);
  (*pAVar3->_vptr_AnchorData[2])();
  (*this->secondEdge->_vptr_AnchorData[2])();
  return;
}

Assistant:

void ParallelAnchorData::updateChildrenSizes()
{
    firstEdge->sizeAtMinimum = sizeAtMinimum;
    firstEdge->sizeAtPreferred = sizeAtPreferred;
    firstEdge->sizeAtMaximum = sizeAtMaximum;

    if (secondForward()) {
        secondEdge->sizeAtMinimum = sizeAtMinimum;
        secondEdge->sizeAtPreferred = sizeAtPreferred;
        secondEdge->sizeAtMaximum = sizeAtMaximum;
    } else {
        secondEdge->sizeAtMinimum = -sizeAtMinimum;
        secondEdge->sizeAtPreferred = -sizeAtPreferred;
        secondEdge->sizeAtMaximum = -sizeAtMaximum;
    }

    firstEdge->updateChildrenSizes();
    secondEdge->updateChildrenSizes();
}